

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O0

void make_bad(artifact *art,wchar_t level)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint local_24;
  wchar_t count2;
  wchar_t count1;
  wchar_t num;
  wchar_t i;
  wchar_t level_local;
  artifact *art_local;
  
  uVar2 = Rand_div(2);
  file_putf(log_file,"Make it bad:\n");
  file_putf(log_file,"   ");
  uVar3 = Rand_div(7);
  if (uVar3 == 0) {
    flag_on_dbg(art->flags,5,0x1a,"art->flags","OF_AGGRAVATE");
    file_putf(log_file," aggravate,");
  }
  uVar3 = Rand_div(4);
  if (uVar3 == 0) {
    flag_on_dbg(art->flags,5,0x1b,"art->flags","OF_DRAIN_EXP");
    file_putf(log_file," drain xp,");
  }
  uVar3 = Rand_div(7);
  if (uVar3 == 0) {
    flag_on_dbg(art->flags,5,0x19,"art->flags","OF_NO_TELEPORT");
    file_putf(log_file," no tele,");
  }
  local_24 = 0;
  for (count1 = L'\0'; count1 < L'\x10'; count1 = count1 + L'\x01') {
    if (((0 < art->modifiers[count1]) && (uVar3 = Rand_div(2), uVar3 == 0)) && (count1 != L'\f')) {
      art->modifiers[count1] = -art->modifiers[count1];
      local_24 = local_24 + 1;
    }
  }
  file_putf(log_file," flip %d of %d modifiers,",(ulong)local_24);
  if ((0 < art->to_a) && (uVar3 = Rand_div(2), uVar3 == 0)) {
    art->to_a = -art->to_a;
    file_putf(log_file," flip ac,");
  }
  if ((0 < art->to_h) && (uVar3 = Rand_div(2), uVar3 == 0)) {
    art->to_h = -art->to_h;
    file_putf(log_file," flip to-hit,");
  }
  if ((0 < art->to_d) && (uVar3 = Rand_div(4), uVar3 == 0)) {
    art->to_d = -art->to_d;
    file_putf(log_file," flip to-dam,");
  }
  local_24 = 0;
  for (count2 = uVar2 + L'\x01'; count2 != L'\0'; count2 = count2 + L'\xffffffff') {
    _Var1 = add_curse(art,level);
    if (_Var1) {
      local_24 = local_24 + 1;
    }
  }
  file_putf(log_file," %d of %d curses applied\n",(ulong)local_24,(ulong)(uint)(uVar2 + L'\x01'));
  return;
}

Assistant:

static void make_bad(struct artifact *art, int level)
{
	int i;
	int num = randint1(2);
	int count1, count2;

	file_putf(log_file, "Make it bad:\n");
	file_putf(log_file, "   ");

	if (one_in_(7)) {
		of_on(art->flags, OF_AGGRAVATE);
		file_putf(log_file, " aggravate,");
	}
	if (one_in_(4)) {
		of_on(art->flags, OF_DRAIN_EXP);
		file_putf(log_file, " drain xp,");
	}
	if (one_in_(7)) {
		of_on(art->flags, OF_NO_TELEPORT);
		file_putf(log_file, " no tele,");
	}

	count1 = 0;
	count2 = 0;
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		if (art->modifiers[i] > 0) {
			++count1;
			if (one_in_(2) && (i != OBJ_MOD_MIGHT)) {
				art->modifiers[i] = -art->modifiers[i];
				++count2;
			}
		}
	}
	file_putf(log_file, " flip %d of %d modifiers,", count2, count1);

	if ((art->to_a > 0) && one_in_(2)) {
		art->to_a = -art->to_a;
		file_putf(log_file, " flip ac,");
	}
	if ((art->to_h > 0) && one_in_(2)) {
		art->to_h = -art->to_h;
		file_putf(log_file, " flip to-hit,");
	}
	if ((art->to_d > 0) && one_in_(4)) {
		art->to_d = -art->to_d;
		file_putf(log_file, " flip to-dam,");
	}

	count1 = num;
	count2 = 0;
	while (num) {
		if (add_curse(art, level)) {
			++count2;
		}
		num--;
	}
	file_putf(log_file, " %d of %d curses applied\n", count2, count1);
}